

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

bool __thiscall
google::protobuf::DescriptorBuilder::OptionInterpreter::InterpretSingleOption
          (OptionInterpreter *this,Message *options,vector<int,_std::allocator<int>_> *src_path,
          vector<int,_std::allocator<int>_> *options_path)

{
  FieldDescriptor **ppFVar1;
  DescriptorBuilder *this_00;
  _Alloc_hider __ptr;
  const_iterator intermediate_fields_iter;
  Message *pMVar2;
  OptionInterpreter *pOVar3;
  vector<int,_std::allocator<int>_> *__k;
  bool bVar4;
  int iVar5;
  undefined4 extraout_var;
  anon_union_8_8_13f84498_for_Symbol_2 aVar6;
  LogMessage *pLVar7;
  void *pvVar8;
  undefined8 *puVar9;
  UninterpretedOption *pUVar10;
  UnknownFieldSet *pUVar11;
  string *psVar12;
  mapped_type *pmVar13;
  long *plVar14;
  mapped_type *this_01;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar15;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar16;
  Reflection *this_02;
  Reflection *this_03;
  anon_union_8_8_13f84498_for_Symbol_2 aVar17;
  undefined8 uVar18;
  ulong uVar19;
  long lVar20;
  iterator iVar21;
  Symbol SVar22;
  FieldDescriptor *field;
  size_type __dnew;
  CodedOutputStream out;
  StringOutputStream outstr;
  unique_ptr<google::protobuf::UnknownFieldSet,_std::default_delete<google::protobuf::UnknownFieldSet>_>
  unknown_fields;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  intermediate_fields;
  vector<int,_std::allocator<int>_> dest_path;
  string debug_msg_name;
  anon_union_8_8_13f84498_for_Symbol_2 local_1c8;
  anon_union_8_8_13f84498_for_Symbol_2 local_1c0;
  undefined8 local_1b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b0 [2];
  anon_union_8_8_13f84498_for_Symbol_2 local_188;
  anon_union_8_8_13f84498_for_Symbol_2 local_180;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_178 [2];
  char local_150;
  uint8 *local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  const_iterator local_f8;
  iterator iStack_f0;
  FieldDescriptor **local_e8;
  vector<int,_std::allocator<int>_> local_e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_c8;
  long local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  Message *local_a8;
  string local_a0;
  OptionInterpreter *local_80;
  vector<int,_std::allocator<int>_> *local_78;
  ulong *local_70;
  long local_68;
  ulong local_60 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  undefined4 extraout_var_00;
  
  if ((this->uninterpreted_option_->name_).super_RepeatedPtrFieldBase.current_size_ == 0) {
    local_188.descriptor = (Descriptor *)local_178;
    local_1c0 = (anon_union_8_8_13f84498_for_Symbol_2)0x18;
    local_188.descriptor =
         (Descriptor *)std::__cxx11::string::_M_create((ulong *)&local_188,(ulong)&local_1c0);
    local_178[0]._M_allocated_capacity = local_1c0;
    *(undefined8 *)local_188.descriptor = 0x6d206e6f6974704f;
    *(undefined8 *)(local_188.descriptor + 8) = 0x6576616820747375;
    *(undefined8 *)(local_188.descriptor + 0x10) = 0x2e656d616e206120;
    local_180 = local_1c0;
    local_188.descriptor[local_1c0.descriptor] = (Descriptor)0x0;
    AddError(this->builder_,&this->options_to_interpret_->element_name,
             &this->uninterpreted_option_->super_Message,OPTION_NAME,(string *)&local_188);
LAB_002ce625:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_188.descriptor != local_178) {
      operator_delete(local_188.descriptor);
    }
    return false;
  }
  iVar5 = std::__cxx11::string::compare
                    (*(char **)((long)((this->uninterpreted_option_->name_).
                                       super_RepeatedPtrFieldBase.rep_)->elements[0] + 0x18));
  if (iVar5 == 0) {
    local_188.descriptor = (Descriptor *)local_178;
    local_1c0 = (anon_union_8_8_13f84498_for_Symbol_2)0x39;
    local_188.descriptor =
         (Descriptor *)std::__cxx11::string::_M_create((ulong *)&local_188,(ulong)&local_1c0);
    local_178[0]._M_allocated_capacity = local_1c0;
    *(undefined8 *)(local_188.descriptor + 0x29) = 0x5f64657465727072;
    *(undefined8 *)(local_188.descriptor + 0x31) = 0x2e226e6f6974706f;
    *(undefined8 *)(local_188.descriptor + 0x20) = 0x746e696e75222065;
    *(undefined8 *)(local_188.descriptor + 0x28) = 0x6465746572707265;
    *(undefined8 *)(local_188.descriptor + 0x10) = 0x6573657220657375;
    *(undefined8 *)(local_188.descriptor + 0x18) = 0x6d616e2064657672;
    *(undefined8 *)local_188.descriptor = 0x6d206e6f6974704f;
    *(undefined8 *)(local_188.descriptor + 8) = 0x20746f6e20747375;
    local_180 = local_1c0;
    local_188.descriptor[local_1c0.descriptor] = (Descriptor)0x0;
    AddError(this->builder_,&this->options_to_interpret_->element_name,
             &this->uninterpreted_option_->super_Message,OPTION_NAME,(string *)&local_188);
    goto LAB_002ce625;
  }
  this_00 = this->builder_;
  local_78 = src_path;
  iVar5 = (*(options->super_MessageLite)._vptr_MessageLite[0x15])(options);
  SVar22 = FindSymbolNotEnforcingDeps(this_00,*(string **)(CONCAT44(extraout_var,iVar5) + 8),true);
  if (SVar22.type != MESSAGE) {
    aVar6._0_4_ = (*(options->super_MessageLite)._vptr_MessageLite[0x15])(options);
    aVar6._4_4_ = extraout_var_00;
    SVar22.field_1.descriptor = aVar6.descriptor;
    SVar22._0_8_ = aVar6;
  }
  aVar6 = SVar22.field_1;
  if ((DescriptorBuilder *)aVar6.descriptor == (DescriptorBuilder *)0x0) {
    internal::LogMessage::LogMessage
              ((LogMessage *)&local_188,LOGLEVEL_FATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/descriptor.cc"
               ,0x18e5);
    pLVar7 = internal::LogMessage::operator<<
                       ((LogMessage *)&local_188,"CHECK failed: options_descriptor: ");
    internal::LogFinisher::operator=((LogFinisher *)&local_1c0,pLVar7);
    internal::LogMessage::~LogMessage((LogMessage *)&local_188);
  }
  local_1c8.descriptor = (Descriptor *)0x0;
  local_e8 = (FieldDescriptor **)0x0;
  local_f8._M_current = (FieldDescriptor **)0x0;
  iStack_f0._M_current = (FieldDescriptor **)0x0;
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  local_a0._M_string_length = 0;
  local_a0.field_2._M_local_buf[0] = '\0';
  local_a8 = options;
  std::vector<int,_std::allocator<int>_>::vector(&local_e0,options_path);
  pUVar10 = this->uninterpreted_option_;
  if (0 < (pUVar10->name_).super_RepeatedPtrFieldBase.current_size_) {
    lVar20 = 0;
    do {
      pvVar8 = ((pUVar10->name_).super_RepeatedPtrFieldBase.rep_)->elements[lVar20];
      psVar12 = *(string **)((long)pvVar8 + 0x18);
      if (local_a0._M_string_length != 0) {
        std::__cxx11::string::append((char *)&local_a0);
        pvVar8 = ((this->uninterpreted_option_->name_).super_RepeatedPtrFieldBase.rep_)->elements
                 [lVar20];
      }
      if (*(char *)((long)pvVar8 + 0x20) == '\x01') {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_1c0,"(",psVar12);
        puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_1c0);
        local_188.descriptor = (Descriptor *)local_178;
        paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(puVar9 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar9 == paVar15) {
          local_178[0]._0_8_ = paVar15->_M_allocated_capacity;
          local_178[0]._8_8_ = puVar9[3];
        }
        else {
          local_178[0]._0_8_ = paVar15->_M_allocated_capacity;
          local_188.descriptor = (Descriptor *)*puVar9;
        }
        local_180 = (anon_union_8_8_13f84498_for_Symbol_2)puVar9[1];
        *puVar9 = paVar15;
        puVar9[1] = 0;
        *(undefined1 *)(puVar9 + 2) = 0;
        std::__cxx11::string::_M_append((char *)&local_a0,(ulong)local_188);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_188.descriptor != local_178) {
          operator_delete(local_188.descriptor);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c0.descriptor != local_1b0) {
          operator_delete(local_1c0.descriptor);
        }
        aVar17 = (anon_union_8_8_13f84498_for_Symbol_2)this->builder_;
        SVar22 = LookupSymbol((DescriptorBuilder *)aVar17.descriptor,psVar12,
                              &this->options_to_interpret_->name_scope,PLACEHOLDER_MESSAGE,
                              LOOKUP_ALL,true);
        if (SVar22.type == FIELD) {
          local_1c8 = SVar22.field_1;
        }
      }
      else {
        std::__cxx11::string::_M_append((char *)&local_a0,(ulong)(psVar12->_M_dataplus)._M_p);
        aVar17 = aVar6;
        local_1c8.field_descriptor = Descriptor::FindFieldByName(aVar6.descriptor,psVar12);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8.descriptor ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        if (this->builder_->pool_->allow_unknown_ == true) {
LAB_002cecfe:
          bVar4 = true;
          AddWithoutInterpreting
                    ((OptionInterpreter *)aVar17.descriptor,this->uninterpreted_option_,local_a8);
          goto LAB_002cf4da;
        }
        if ((this->builder_->undefine_resolved_name_)._M_string_length == 0) {
          std::operator+(&local_138,"Option \"",&local_a0);
          puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_138);
          paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(puVar9 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar9 == paVar15) {
            local_1b0[0]._0_8_ = paVar15->_M_allocated_capacity;
            local_1b0[0]._8_8_ = puVar9[3];
            local_1c0.descriptor = (Descriptor *)local_1b0;
          }
          else {
            local_1b0[0]._0_8_ = paVar15->_M_allocated_capacity;
            local_1c0.descriptor = (Descriptor *)*puVar9;
          }
          local_1b8 = puVar9[1];
          *puVar9 = paVar15;
          puVar9[1] = 0;
          *(undefined1 *)(puVar9 + 2) = 0;
          puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_1c0);
          paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(puVar9 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar9 == paVar15) {
            local_178[0]._0_8_ = paVar15->_M_allocated_capacity;
            local_178[0]._8_8_ = puVar9[3];
            local_188.descriptor = (Descriptor *)local_178;
          }
          else {
            local_178[0]._0_8_ = paVar15->_M_allocated_capacity;
            local_188.descriptor = (Descriptor *)*puVar9;
          }
          local_180 = (anon_union_8_8_13f84498_for_Symbol_2)puVar9[1];
          *puVar9 = paVar15;
          puVar9[1] = 0;
          *(undefined1 *)(puVar9 + 2) = 0;
          AddError(this->builder_,&this->options_to_interpret_->element_name,
                   &this->uninterpreted_option_->super_Message,OPTION_NAME,(string *)&local_188);
          if (local_188.descriptor != (Descriptor *)local_178) {
            operator_delete(local_188.descriptor);
          }
          if (local_1c0.descriptor != (Descriptor *)local_1b0) {
            operator_delete(local_1c0.descriptor);
          }
          paVar15 = &local_138.field_2;
          goto LAB_002cf4ca;
        }
        std::operator+(&local_50,"Option \"",&local_a0);
        plVar14 = (long *)std::__cxx11::string::append((char *)&local_50);
        paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(plVar14 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar14 == paVar15) {
          local_b8._M_allocated_capacity = paVar15->_M_allocated_capacity;
          local_b8._8_8_ = plVar14[3];
          local_c8 = &local_b8;
        }
        else {
          local_b8._M_allocated_capacity = paVar15->_M_allocated_capacity;
          local_c8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)*plVar14;
        }
        local_c0 = plVar14[1];
        *plVar14 = (long)paVar15;
        plVar14[1] = 0;
        *(undefined1 *)(plVar14 + 2) = 0;
        plVar14 = (long *)std::__cxx11::string::_M_append
                                    ((char *)&local_c8,
                                     (ulong)(this->builder_->undefine_resolved_name_)._M_dataplus.
                                            _M_p);
        paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(plVar14 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar14 == paVar15) {
          local_118.field_2._M_allocated_capacity = paVar15->_M_allocated_capacity;
          local_118.field_2._8_8_ = plVar14[3];
          local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
        }
        else {
          local_118.field_2._M_allocated_capacity = paVar15->_M_allocated_capacity;
          local_118._M_dataplus._M_p = (pointer)*plVar14;
        }
        local_118._M_string_length = plVar14[1];
        *plVar14 = (long)paVar15;
        plVar14[1] = 0;
        *(undefined1 *)(plVar14 + 2) = 0;
        puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_118);
        paVar15 = &local_138.field_2;
        paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(puVar9 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar9 == paVar16) {
          local_138.field_2._M_allocated_capacity = paVar16->_M_allocated_capacity;
          local_138.field_2._8_8_ = puVar9[3];
          local_138._M_dataplus._M_p = (pointer)paVar15;
        }
        else {
          local_138.field_2._M_allocated_capacity = paVar16->_M_allocated_capacity;
          local_138._M_dataplus._M_p = (pointer)*puVar9;
        }
        local_138._M_string_length = puVar9[1];
        *puVar9 = paVar16;
        puVar9[1] = 0;
        *(undefined1 *)(puVar9 + 2) = 0;
        std::__cxx11::string::substr((ulong)&local_70,(ulong)&local_a0);
        uVar18 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_138._M_dataplus._M_p != paVar15) {
          uVar18 = local_138.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar18 < local_138._M_string_length + local_68) {
          uVar19 = 0xf;
          if (local_70 != local_60) {
            uVar19 = local_60[0];
          }
          if (uVar19 < local_138._M_string_length + local_68) goto LAB_002cf2ca;
          puVar9 = (undefined8 *)
                   std::__cxx11::string::replace
                             ((ulong)&local_70,0,(char *)0x0,(ulong)local_138._M_dataplus._M_p);
        }
        else {
LAB_002cf2ca:
          puVar9 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_138,(ulong)local_70)
          ;
        }
        paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(puVar9 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar9 == paVar16) {
          local_1b0[0]._0_8_ = paVar16->_M_allocated_capacity;
          local_1b0[0]._8_8_ = puVar9[3];
          local_1c0.descriptor = (Descriptor *)local_1b0;
        }
        else {
          local_1b0[0]._0_8_ = paVar16->_M_allocated_capacity;
          local_1c0.descriptor = (Descriptor *)*puVar9;
        }
        local_1b8 = puVar9[1];
        *puVar9 = paVar16;
        puVar9[1] = 0;
        paVar16->_M_local_buf[0] = '\0';
        puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_1c0);
        paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(puVar9 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar9 == paVar16) {
          local_178[0]._0_8_ = paVar16->_M_allocated_capacity;
          local_178[0]._8_8_ = puVar9[3];
          local_188.descriptor = (Descriptor *)local_178;
        }
        else {
          local_178[0]._0_8_ = paVar16->_M_allocated_capacity;
          local_188.descriptor = (Descriptor *)*puVar9;
        }
        local_180 = (anon_union_8_8_13f84498_for_Symbol_2)puVar9[1];
        *puVar9 = paVar16;
        puVar9[1] = 0;
        *(undefined1 *)(puVar9 + 2) = 0;
        AddError(this->builder_,&this->options_to_interpret_->element_name,
                 &this->uninterpreted_option_->super_Message,OPTION_NAME,(string *)&local_188);
        if (local_188.descriptor != (Descriptor *)local_178) {
          operator_delete(local_188.descriptor);
        }
        if (local_1c0.descriptor != (Descriptor *)local_1b0) {
          operator_delete(local_1c0.descriptor);
        }
        if (local_70 != local_60) {
          operator_delete(local_70);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_138._M_dataplus._M_p != paVar15) {
          operator_delete(local_138._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_118._M_dataplus._M_p != &local_118.field_2) {
          operator_delete(local_118._M_dataplus._M_p);
        }
        if (local_c8 != &local_b8) {
          operator_delete(local_c8);
        }
        paVar15 = &local_50.field_2;
LAB_002cf4ca:
        aVar6 = (anon_union_8_8_13f84498_for_Symbol_2)
                ((anon_union_8_8_13f84498_for_Symbol_2 *)(paVar15->_M_local_buf + -0x10))->
                descriptor;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)aVar6.descriptor != paVar15) {
LAB_002cf4d3:
          operator_delete(aVar6.descriptor);
        }
        goto LAB_002cf4d8;
      }
      if (*(DescriptorBuilder **)(local_1c8.descriptor + 0x50) !=
          (DescriptorBuilder *)aVar6.descriptor) {
        if (*(char *)&((*(DescriptorBuilder **)(local_1c8.descriptor + 0x50))->dependencies_)._M_t.
                      _M_impl.super__Rb_tree_header._M_header._M_right != '\0') goto LAB_002cecfe;
        std::operator+(&local_118,"Option field \"",&local_a0);
        plVar14 = (long *)std::__cxx11::string::append((char *)&local_118);
        paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(plVar14 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar14 == paVar15) {
          local_138.field_2._M_allocated_capacity = paVar15->_M_allocated_capacity;
          local_138.field_2._8_8_ = plVar14[3];
          local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
        }
        else {
          local_138.field_2._M_allocated_capacity = paVar15->_M_allocated_capacity;
          local_138._M_dataplus._M_p = (pointer)*plVar14;
        }
        local_138._M_string_length = plVar14[1];
        *plVar14 = (long)paVar15;
        plVar14[1] = 0;
        *(undefined1 *)(plVar14 + 2) = 0;
        puVar9 = (undefined8 *)
                 std::__cxx11::string::_M_append((char *)&local_138,**(ulong **)aVar6.descriptor);
        paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(puVar9 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar9 == paVar15) {
          local_1b0[0]._0_8_ = paVar15->_M_allocated_capacity;
          local_1b0[0]._8_8_ = puVar9[3];
          local_1c0.descriptor = (Descriptor *)local_1b0;
        }
        else {
          local_1b0[0]._0_8_ = paVar15->_M_allocated_capacity;
          local_1c0.descriptor = (Descriptor *)*puVar9;
        }
        local_1b8 = puVar9[1];
        *puVar9 = paVar15;
        puVar9[1] = 0;
        *(undefined1 *)(puVar9 + 2) = 0;
        puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_1c0);
        paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(puVar9 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar9 == paVar15) {
          local_178[0]._0_8_ = paVar15->_M_allocated_capacity;
          local_178[0]._8_8_ = puVar9[3];
          local_188.descriptor = (Descriptor *)local_178;
        }
        else {
          local_178[0]._0_8_ = paVar15->_M_allocated_capacity;
          local_188.descriptor = (Descriptor *)*puVar9;
        }
        local_180 = (anon_union_8_8_13f84498_for_Symbol_2)puVar9[1];
        *puVar9 = paVar15;
        puVar9[1] = 0;
        *(undefined1 *)(puVar9 + 2) = 0;
        AddError(this->builder_,&this->options_to_interpret_->element_name,
                 &this->uninterpreted_option_->super_Message,OPTION_NAME,(string *)&local_188);
        if (local_188.descriptor != (Descriptor *)local_178) {
          operator_delete(local_188.descriptor);
        }
        if (local_1c0.descriptor != (Descriptor *)local_1b0) {
          operator_delete(local_1c0.descriptor);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_138._M_dataplus._M_p != &local_138.field_2) {
          operator_delete(local_138._M_dataplus._M_p);
        }
        paVar15 = &local_118.field_2;
        goto LAB_002cf4ca;
      }
      local_188._0_4_ = *(int *)(local_1c8.descriptor + 0x44);
      if (local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish ==
          local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  (&local_e0,
                   (iterator)
                   local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish,(int *)&local_188);
      }
      else {
        *local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish = *(int *)(local_1c8.descriptor + 0x44);
        local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish + 1;
      }
      aVar17 = local_1c8;
      pUVar10 = this->uninterpreted_option_;
      iVar5 = (pUVar10->name_).super_RepeatedPtrFieldBase.current_size_;
      if (lVar20 < (long)iVar5 + -1) {
        if (*(once_flag **)(local_1c8.descriptor + 0x30) != (once_flag *)0x0) {
          local_188.descriptor = (Descriptor *)FieldDescriptor::TypeOnceInit;
          local_1c0.descriptor = local_1c8.descriptor;
          std::
          call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                    (*(once_flag **)(local_1c8.descriptor + 0x30),
                     (_func_void_FieldDescriptor_ptr **)&local_188.descriptor,
                     &local_1c0.field_descriptor);
        }
        if ((*(uint *)(aVar17.descriptor + 0x38) & 0xfffffffe) == 10) {
          if (*(int *)(local_1c8.descriptor + 0x3c) != 3) {
            if (iStack_f0._M_current == local_e8) {
              std::
              vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
              ::_M_realloc_insert<google::protobuf::FieldDescriptor_const*const&>
                        ((vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
                          *)&local_f8,iStack_f0,&local_1c8.field_descriptor);
            }
            else {
              *iStack_f0._M_current = (FieldDescriptor *)local_1c8;
              iStack_f0._M_current = iStack_f0._M_current + 1;
            }
            aVar6 = local_1c8;
            if (*(once_flag **)(local_1c8.descriptor + 0x30) != (once_flag *)0x0) {
              local_188.descriptor = local_1c8.descriptor;
              std::
              call_once<void(&)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                        (*(once_flag **)(local_1c8.descriptor + 0x30),FieldDescriptor::TypeOnceInit,
                         &local_188.field_descriptor);
            }
            aVar6 = (anon_union_8_8_13f84498_for_Symbol_2)
                    ((anon_union_8_8_13f84498_for_Symbol_2 *)(aVar6.descriptor + 0x68))->descriptor;
            pUVar10 = this->uninterpreted_option_;
            iVar5 = (pUVar10->name_).super_RepeatedPtrFieldBase.current_size_;
            goto LAB_002ce92f;
          }
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_1c0,"Option field \"",&local_a0);
          puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_1c0);
          local_188.descriptor = (Descriptor *)local_178;
          paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(puVar9 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar9 == paVar15) {
            local_178[0]._0_8_ = paVar15->_M_allocated_capacity;
            local_178[0]._8_8_ = puVar9[3];
          }
          else {
            local_178[0]._0_8_ = paVar15->_M_allocated_capacity;
            local_188.descriptor = (Descriptor *)*puVar9;
          }
          local_180 = (anon_union_8_8_13f84498_for_Symbol_2)puVar9[1];
          *puVar9 = paVar15;
          puVar9[1] = 0;
          *(undefined1 *)(puVar9 + 2) = 0;
          AddError(this->builder_,&this->options_to_interpret_->element_name,
                   &this->uninterpreted_option_->super_Message,OPTION_NAME,(string *)&local_188);
        }
        else {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_1c0,"Option \"",&local_a0);
          puVar9 = (undefined8 *)std::__cxx11::string::append((char *)&local_1c0);
          local_188.descriptor = (Descriptor *)local_178;
          paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(puVar9 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar9 == paVar15) {
            local_178[0]._0_8_ = paVar15->_M_allocated_capacity;
            local_178[0]._8_8_ = puVar9[3];
          }
          else {
            local_178[0]._0_8_ = paVar15->_M_allocated_capacity;
            local_188.descriptor = (Descriptor *)*puVar9;
          }
          local_180 = (anon_union_8_8_13f84498_for_Symbol_2)puVar9[1];
          *puVar9 = paVar15;
          puVar9[1] = 0;
          *(undefined1 *)(puVar9 + 2) = 0;
          AddError(this->builder_,&this->options_to_interpret_->element_name,
                   &this->uninterpreted_option_->super_Message,OPTION_NAME,(string *)&local_188);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_188.descriptor != local_178) {
          operator_delete(local_188.descriptor);
        }
        aVar6 = local_1c0;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c0.descriptor != local_1b0) goto LAB_002cf4d3;
        goto LAB_002cf4d8;
      }
LAB_002ce92f:
      lVar20 = lVar20 + 1;
    } while (lVar20 < iVar5);
  }
  pMVar2 = local_a8;
  iVar21._M_current = iStack_f0._M_current;
  intermediate_fields_iter._M_current = local_f8._M_current;
  aVar6 = local_1c8;
  if (*(int *)(local_1c8.descriptor + 0x3c) != 3) {
    (*(local_a8->super_MessageLite)._vptr_MessageLite[0x15])(local_a8);
    pUVar11 = Reflection::GetUnknownFields(this_02,pMVar2);
    bVar4 = ExamineIfOptionIsSet
                      (this,intermediate_fields_iter,(const_iterator)iVar21._M_current,
                       aVar6.field_descriptor,&local_a0,pUVar11);
    if (!bVar4) {
LAB_002cf4d8:
      bVar4 = false;
      goto LAB_002cf4da;
    }
  }
  local_118._M_dataplus._M_p = (pointer)operator_new(0x18);
  *(size_type *)local_118._M_dataplus._M_p = 0;
  *(pointer *)((long)local_118._M_dataplus._M_p + 8) = (pointer)0x0;
  ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
    *)((long)local_118._M_dataplus._M_p + 0x10))->_M_allocated_capacity = 0;
  bVar4 = SetOptionValue(this,local_1c8.field_descriptor,
                         (UnknownFieldSet *)local_118._M_dataplus._M_p);
  if (bVar4) {
    local_80 = this;
    if (iStack_f0._M_current != local_f8._M_current) {
      iVar21._M_current = iStack_f0._M_current;
      do {
        local_c8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)operator_new(0x18);
        local_c8->_M_allocated_capacity = 0;
        *(undefined8 *)((long)local_c8 + 8) = 0;
        local_c8[1]._M_allocated_capacity = 0;
        aVar6 = (anon_union_8_8_13f84498_for_Symbol_2)iVar21._M_current[-1];
        if (*(once_flag **)(aVar6.descriptor + 0x30) != (once_flag *)0x0) {
          local_188.descriptor = (Descriptor *)FieldDescriptor::TypeOnceInit;
          local_1c0 = aVar6;
          std::
          call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                    (*(once_flag **)(aVar6.descriptor + 0x30),
                     (_func_void_FieldDescriptor_ptr **)&local_188.descriptor,
                     &local_1c0.field_descriptor);
        }
        ppFVar1 = iVar21._M_current + -1;
        if (*(int *)(aVar6.descriptor + 0x38) == 10) {
          pUVar11 = UnknownFieldSet::AddGroup((UnknownFieldSet *)local_c8,*(int *)(*ppFVar1 + 0x44))
          ;
          UnknownFieldSet::MergeFrom(pUVar11,(UnknownFieldSet *)local_118._M_dataplus._M_p);
        }
        else {
          if (*(int *)(aVar6.descriptor + 0x38) != 0xb) {
            internal::LogMessage::LogMessage
                      ((LogMessage *)&local_188,LOGLEVEL_FATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/descriptor.cc"
                       ,0x197c);
            pLVar7 = internal::LogMessage::operator<<
                               ((LogMessage *)&local_188,"Invalid wire type for CPPTYPE_MESSAGE: ");
            paVar15 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)iVar21._M_current[-1];
            if (*(once_flag **)(paVar15->_M_local_buf + 0x30) != (once_flag *)0x0) {
              local_1c0.descriptor = (Descriptor *)FieldDescriptor::TypeOnceInit;
              local_138._M_dataplus._M_p = (pointer)paVar15;
              std::
              call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                        (*(once_flag **)(paVar15->_M_local_buf + 0x30),
                         (_func_void_FieldDescriptor_ptr **)&local_1c0.descriptor,
                         (FieldDescriptor **)&local_138);
            }
            pLVar7 = internal::LogMessage::operator<<
                               (pLVar7,(int)*(long *)(paVar15->_M_local_buf + 0x38));
            internal::LogFinisher::operator=((LogFinisher *)&local_1c0,pLVar7);
            internal::LogMessage::~LogMessage((LogMessage *)&local_188);
            if (local_c8 !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0) {
              std::default_delete<google::protobuf::UnknownFieldSet>::operator()
                        ((default_delete<google::protobuf::UnknownFieldSet> *)&local_c8,
                         (UnknownFieldSet *)local_c8);
            }
            goto LAB_002ceedb;
          }
          psVar12 = UnknownFieldSet::AddLengthDelimited_abi_cxx11_
                              ((UnknownFieldSet *)local_c8,*(int *)(*ppFVar1 + 0x44));
          io::StringOutputStream::StringOutputStream((StringOutputStream *)&local_138,psVar12);
          io::CodedOutputStream::CodedOutputStream
                    ((CodedOutputStream *)&local_188,(ZeroCopyOutputStream *)&local_138,true);
          local_148 = internal::WireFormat::InternalSerializeUnknownFieldsToArray
                                ((UnknownFieldSet *)local_118._M_dataplus._M_p,local_148,
                                 (EpsCopyOutputStream *)&local_188);
          local_148 = io::EpsCopyOutputStream::FlushAndResetBuffer
                                ((EpsCopyOutputStream *)&local_188,local_148);
          if (local_150 == '\x01') {
            internal::LogMessage::LogMessage
                      ((LogMessage *)&local_1c0,LOGLEVEL_FATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/descriptor.cc"
                       ,0x196f);
            pLVar7 = internal::LogMessage::operator<<
                               ((LogMessage *)&local_1c0,"CHECK failed: !out.HadError(): ");
            pLVar7 = internal::LogMessage::operator<<
                               (pLVar7,"Unexpected failure while serializing option submessage ");
            pLVar7 = internal::LogMessage::operator<<(pLVar7,&local_a0);
            pLVar7 = internal::LogMessage::operator<<(pLVar7,"\".");
            internal::LogFinisher::operator=((LogFinisher *)&local_50,pLVar7);
            internal::LogMessage::~LogMessage((LogMessage *)&local_1c0);
          }
          io::CodedOutputStream::~CodedOutputStream((CodedOutputStream *)&local_188);
        }
        paVar15 = local_c8;
        __ptr._M_p = local_118._M_dataplus._M_p;
        local_c8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)0x0;
        local_118._M_dataplus._M_p = (pointer)paVar15;
        if (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)__ptr._M_p !=
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0) &&
           (std::default_delete<google::protobuf::UnknownFieldSet>::operator()
                      ((default_delete<google::protobuf::UnknownFieldSet> *)&local_118,
                       (UnknownFieldSet *)__ptr._M_p),
           local_c8 !=
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0)) {
          std::default_delete<google::protobuf::UnknownFieldSet>::operator()
                    ((default_delete<google::protobuf::UnknownFieldSet> *)&local_c8,
                     (UnknownFieldSet *)local_c8);
        }
        iVar21._M_current = ppFVar1;
      } while (ppFVar1 != local_f8._M_current);
    }
    pMVar2 = local_a8;
    (*(local_a8->super_MessageLite)._vptr_MessageLite[0x15])(local_a8);
    __k = local_78;
    pOVar3 = local_80;
    pUVar11 = Reflection::MutableUnknownFields(this_03,pMVar2);
    UnknownFieldSet::MergeFrom(pUVar11,(UnknownFieldSet *)local_118._M_dataplus._M_p);
    if (*(int *)(local_1c8.descriptor + 0x3c) == 3) {
      pmVar13 = std::
                map<std::vector<int,_std::allocator<int>_>,_int,_std::less<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_int>_>_>
                ::operator[](&pOVar3->repeated_option_counts_,&local_e0);
      iVar5 = *pmVar13;
      *pmVar13 = iVar5 + 1;
      local_188._0_4_ = iVar5;
      if (local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish ==
          local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)&local_e0,
                   (iterator)
                   local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish,(int *)&local_188);
      }
      else {
        *local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish = iVar5;
        local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish + 1;
      }
    }
    this_01 = std::
              map<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>,_std::less<std::vector<int,_std::allocator<int>_>_>,_std::allocator<std::pair<const_std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
              ::operator[](&pOVar3->interpreted_paths_,__k);
    bVar4 = true;
    std::vector<int,_std::allocator<int>_>::operator=(this_01,&local_e0);
  }
  else {
LAB_002ceedb:
    bVar4 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    std::default_delete<google::protobuf::UnknownFieldSet>::operator()
              ((default_delete<google::protobuf::UnknownFieldSet> *)&local_118,
               (UnknownFieldSet *)local_118._M_dataplus._M_p);
  }
LAB_002cf4da:
  if (local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_e0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p);
  }
  if (local_f8._M_current == (FieldDescriptor **)0x0) {
    return bVar4;
  }
  operator_delete(local_f8._M_current);
  return bVar4;
}

Assistant:

bool DescriptorBuilder::OptionInterpreter::InterpretSingleOption(
    Message* options, const std::vector<int>& src_path,
    const std::vector<int>& options_path) {
  // First do some basic validation.
  if (uninterpreted_option_->name_size() == 0) {
    // This should never happen unless the parser has gone seriously awry or
    // someone has manually created the uninterpreted option badly.
    return AddNameError("Option must have a name.");
  }
  if (uninterpreted_option_->name(0).name_part() == "uninterpreted_option") {
    return AddNameError(
        "Option must not use reserved name "
        "\"uninterpreted_option\".");
  }

  const Descriptor* options_descriptor = nullptr;
  // Get the options message's descriptor from the builder's pool, so that we
  // get the version that knows about any extension options declared in the file
  // we're currently building. The descriptor should be there as long as the
  // file we're building imported descriptor.proto.

  // Note that we use DescriptorBuilder::FindSymbolNotEnforcingDeps(), not
  // DescriptorPool::FindMessageTypeByName() because we're already holding the
  // pool's mutex, and the latter method locks it again.  We don't use
  // FindSymbol() because files that use custom options only need to depend on
  // the file that defines the option, not descriptor.proto itself.
  Symbol symbol = builder_->FindSymbolNotEnforcingDeps(
      options->GetDescriptor()->full_name());
  if (!symbol.IsNull() && symbol.type == Symbol::MESSAGE) {
    options_descriptor = symbol.descriptor;
  } else {
    // The options message's descriptor was not in the builder's pool, so use
    // the standard version from the generated pool. We're not holding the
    // generated pool's mutex, so we can search it the straightforward way.
    options_descriptor = options->GetDescriptor();
  }
  GOOGLE_CHECK(options_descriptor);

  // We iterate over the name parts to drill into the submessages until we find
  // the leaf field for the option. As we drill down we remember the current
  // submessage's descriptor in |descriptor| and the next field in that
  // submessage in |field|. We also track the fields we're drilling down
  // through in |intermediate_fields|. As we go, we reconstruct the full option
  // name in |debug_msg_name|, for use in error messages.
  const Descriptor* descriptor = options_descriptor;
  const FieldDescriptor* field = nullptr;
  std::vector<const FieldDescriptor*> intermediate_fields;
  std::string debug_msg_name = "";

  std::vector<int> dest_path = options_path;

  for (int i = 0; i < uninterpreted_option_->name_size(); ++i) {
    const std::string& name_part = uninterpreted_option_->name(i).name_part();
    if (debug_msg_name.size() > 0) {
      debug_msg_name += ".";
    }
    if (uninterpreted_option_->name(i).is_extension()) {
      debug_msg_name += "(" + name_part + ")";
      // Search for the extension's descriptor as an extension in the builder's
      // pool. Note that we use DescriptorBuilder::LookupSymbol(), not
      // DescriptorPool::FindExtensionByName(), for two reasons: 1) It allows
      // relative lookups, and 2) because we're already holding the pool's
      // mutex, and the latter method locks it again.
      symbol =
          builder_->LookupSymbol(name_part, options_to_interpret_->name_scope);
      if (!symbol.IsNull() && symbol.type == Symbol::FIELD) {
        field = symbol.field_descriptor;
      }
      // If we don't find the field then the field's descriptor was not in the
      // builder's pool, but there's no point in looking in the generated
      // pool. We require that you import the file that defines any extensions
      // you use, so they must be present in the builder's pool.
    } else {
      debug_msg_name += name_part;
      // Search for the field's descriptor as a regular field.
      field = descriptor->FindFieldByName(name_part);
    }

    if (field == nullptr) {
      if (get_allow_unknown(builder_->pool_)) {
        // We can't find the option, but AllowUnknownDependencies() is enabled,
        // so we will just leave it as uninterpreted.
        AddWithoutInterpreting(*uninterpreted_option_, options);
        return true;
      } else if (!(builder_->undefine_resolved_name_).empty()) {
        // Option is resolved to a name which is not defined.
        return AddNameError(
            "Option \"" + debug_msg_name + "\" is resolved to \"(" +
            builder_->undefine_resolved_name_ +
            ")\", which is not defined. The innermost scope is searched first "
            "in name resolution. Consider using a leading '.'(i.e., \"(." +
            debug_msg_name.substr(1) +
            "\") to start from the outermost scope.");
      } else {
        return AddNameError(
            "Option \"" + debug_msg_name +
            "\" unknown. Ensure that your proto" +
            " definition file imports the proto which defines the option.");
      }
    } else if (field->containing_type() != descriptor) {
      if (get_is_placeholder(field->containing_type())) {
        // The field is an extension of a placeholder type, so we can't
        // reliably verify whether it is a valid extension to use here (e.g.
        // we don't know if it is an extension of the correct *Options message,
        // or if it has a valid field number, etc.).  Just leave it as
        // uninterpreted instead.
        AddWithoutInterpreting(*uninterpreted_option_, options);
        return true;
      } else {
        // This can only happen if, due to some insane misconfiguration of the
        // pools, we find the options message in one pool but the field in
        // another. This would probably imply a hefty bug somewhere.
        return AddNameError("Option field \"" + debug_msg_name +
                            "\" is not a field or extension of message \"" +
                            descriptor->name() + "\".");
      }
    } else {
      // accumulate field numbers to form path to interpreted option
      dest_path.push_back(field->number());

      if (i < uninterpreted_option_->name_size() - 1) {
        if (field->cpp_type() != FieldDescriptor::CPPTYPE_MESSAGE) {
          return AddNameError("Option \"" + debug_msg_name +
                              "\" is an atomic type, not a message.");
        } else if (field->is_repeated()) {
          return AddNameError("Option field \"" + debug_msg_name +
                              "\" is a repeated message. Repeated message "
                              "options must be initialized using an "
                              "aggregate value.");
        } else {
          // Drill down into the submessage.
          intermediate_fields.push_back(field);
          descriptor = field->message_type();
        }
      }
    }
  }

  // We've found the leaf field. Now we use UnknownFieldSets to set its value
  // on the options message. We do so because the message may not yet know
  // about its extension fields, so we may not be able to set the fields
  // directly. But the UnknownFieldSets will serialize to the same wire-format
  // message, so reading that message back in once the extension fields are
  // known will populate them correctly.

  // First see if the option is already set.
  if (!field->is_repeated() &&
      !ExamineIfOptionIsSet(
          intermediate_fields.begin(), intermediate_fields.end(), field,
          debug_msg_name,
          options->GetReflection()->GetUnknownFields(*options))) {
    return false;  // ExamineIfOptionIsSet() already added the error.
  }

  // First set the value on the UnknownFieldSet corresponding to the
  // innermost message.
  std::unique_ptr<UnknownFieldSet> unknown_fields(new UnknownFieldSet());
  if (!SetOptionValue(field, unknown_fields.get())) {
    return false;  // SetOptionValue() already added the error.
  }

  // Now wrap the UnknownFieldSet with UnknownFieldSets corresponding to all
  // the intermediate messages.
  for (std::vector<const FieldDescriptor*>::reverse_iterator iter =
           intermediate_fields.rbegin();
       iter != intermediate_fields.rend(); ++iter) {
    std::unique_ptr<UnknownFieldSet> parent_unknown_fields(
        new UnknownFieldSet());
    switch ((*iter)->type()) {
      case FieldDescriptor::TYPE_MESSAGE: {
        io::StringOutputStream outstr(
            parent_unknown_fields->AddLengthDelimited((*iter)->number()));
        io::CodedOutputStream out(&outstr);
        internal::WireFormat::SerializeUnknownFields(*unknown_fields, &out);
        GOOGLE_CHECK(!out.HadError())
            << "Unexpected failure while serializing option submessage "
            << debug_msg_name << "\".";
        break;
      }

      case FieldDescriptor::TYPE_GROUP: {
        parent_unknown_fields->AddGroup((*iter)->number())
            ->MergeFrom(*unknown_fields);
        break;
      }

      default:
        GOOGLE_LOG(FATAL) << "Invalid wire type for CPPTYPE_MESSAGE: "
                   << (*iter)->type();
        return false;
    }
    unknown_fields.reset(parent_unknown_fields.release());
  }

  // Now merge the UnknownFieldSet corresponding to the top-level message into
  // the options message.
  options->GetReflection()->MutableUnknownFields(options)->MergeFrom(
      *unknown_fields);

  // record the element path of the interpreted option
  if (field->is_repeated()) {
    int index = repeated_option_counts_[dest_path]++;
    dest_path.push_back(index);
  }
  interpreted_paths_[src_path] = dest_path;

  return true;
}